

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

bool __thiscall ON_NurbsCurve::IsNatural(ON_NurbsCurve *this,int end)

{
  bool bVar1;
  bool bVar2;
  uint i;
  int iVar3;
  int side;
  bool bVar4;
  double dVar5;
  double dVar6;
  ON_Interval domain;
  ON_BezierCurve span;
  ON_3dVector D2;
  ON_3dPoint CV2;
  ON_3dPoint CV0;
  ON_3dVector D1;
  ON_3dPoint P;
  ON_Interval local_d8;
  ON_BezierCurve local_c8;
  ON_3dVector local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dVector local_60;
  ON_3dPoint local_48;
  
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  i = (uint)((end & 0xfffffffdU) != 0);
  bVar2 = false;
  do {
    if ((end - 1U < 2) + 1 <= i) {
      return bVar2;
    }
    ON_BezierCurve::ON_BezierCurve(&local_c8);
    iVar3 = this->m_cv_count - this->m_order;
    if (i == 0) {
      iVar3 = 0;
    }
    bVar1 = ConvertSpanToBezier(this,iVar3,&local_c8);
    if (bVar1 && 1 < local_c8.m_order) {
      iVar3 = local_c8.m_order - 1;
      if (i == 0) {
        iVar3 = 0;
      }
      side = (uint)(i == 0) * 2 + -1;
      bVar4 = 2 < (uint)local_c8.m_order;
      bVar1 = ON_BezierCurve::GetCV(&local_c8,iVar3,&local_78);
      if ((!bVar1) ||
         (bVar1 = ON_BezierCurve::GetCV(&local_c8,(side << bVar4) + iVar3,&local_90), !bVar1))
      goto LAB_0054ef8f;
      dVar5 = ON_Interval::operator[](&local_d8,i);
      ON_Curve::Ev2Der(&this->super_ON_Curve,dVar5,&local_48,&local_60,&local_a8,side,(int *)0x0);
      dVar5 = ON_3dVector::Length(&local_a8);
      dVar6 = ON_3dPoint::DistanceTo(&local_78,&local_90);
      bVar1 = dVar5 <= dVar6 * 1e-08;
      bVar2 = (bool)(bVar2 | bVar1);
    }
    else {
LAB_0054ef8f:
      bVar1 = false;
    }
    ON_BezierCurve::~ON_BezierCurve(&local_c8);
    i = i + 1;
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool ON_NurbsCurve::IsNatural(int end) const
{
  bool rc = false;
  ON_3dPoint CV0, CV2, P;
  ON_3dVector D1, D2;
  const ON_Interval domain(Domain());
  for (int pass = ((0==end||2==end) ? 0 : 1); pass < ((1==end||2==end)?2 : 1); ++pass)
  {
    ON_BezierCurve span;
    if (false == ConvertSpanToBezier(((0 == pass) ? 0 : (m_cv_count - m_order)), span) || span.m_order < 2)
      return false;
    int i0 = (0 == pass) ? 0 : span.m_order - 1;
    int di = (0 == pass) ? 1 : -1;
    if (span.m_order > 2)
      di *= 2;
    if (false == span.GetCV(i0, CV0))
      return false;
    if (false == span.GetCV(i0 + di, CV2))
      return false;
    Ev2Der(domain[pass], P, D1, D2, (0 == pass) ? 1 : -1);
    const double d2 = D2.Length();
    const double tol = CV0.DistanceTo(CV2)*1.0e-8;
    if (false == (d2 <= tol))
      return false;
    rc = true;      
  }
  return rc;
}